

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O1

int __thiscall
FIX::FieldMap::calculateLength
          (FieldMap *this,int beginStringField,int bodyLengthField,int checkSumField)

{
  int iVar1;
  _Rb_tree_node_base *p_Var2;
  int iVar3;
  pointer this_00;
  _Base_ptr p_Var4;
  
  this_00 = (this->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (this_00 ==
      (this->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    do {
      iVar1 = this_00->m_tag;
      if (((iVar1 != checkSumField) && (iVar1 != beginStringField)) && (iVar1 != bodyLengthField)) {
        FieldBase::calculate(this_00);
        iVar3 = iVar3 + (int)(this_00->m_metrics).m_length;
      }
      this_00 = this_00 + 1;
    } while (this_00 !=
             (this->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  for (p_Var2 = (this->m_groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->m_groups)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    for (p_Var4 = p_Var2[1]._M_parent; p_Var4 != p_Var2[1]._M_left;
        p_Var4 = (_Base_ptr)&p_Var4->_M_parent) {
      iVar1 = calculateLength(*(FieldMap **)p_Var4,8,9,10);
      iVar3 = iVar3 + iVar1;
    }
  }
  return iVar3;
}

Assistant:

int FieldMap::calculateLength( int beginStringField,
                               int bodyLengthField,
                               int checkSumField ) const
{
  int result = 0;
  Fields::const_iterator i;
  for ( i = m_fields.begin(); i != m_fields.end(); ++i )
  {
    int tag = i->getTag();
    if ( tag != beginStringField
         && tag != bodyLengthField
         && tag != checkSumField )
    { result += i->getLength(); }
  }

  Groups::const_iterator j;
  for ( j = m_groups.begin(); j != m_groups.end(); ++j )
  {
    std::vector < FieldMap* > ::const_iterator k;
    for ( k = j->second.begin(); k != j->second.end(); ++k )
      result += ( *k ) ->calculateLength();
  }
  return result;
}